

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

StatusOr<google::protobuf::FeatureSet> *
google::protobuf::internal::GetEditionFeatureSetDefaults
          (StatusOr<google::protobuf::FeatureSet> *__return_storage_ptr__,Edition edition,
          FeatureSetDefaults *defaults)

{
  bool bVar1;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *pRVar2;
  pointer pFVar3;
  FeatureSet *pFVar4;
  RepeatedPtrIterator<const_google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> local_f0;
  void **local_e8;
  RepeatedPtrIterator<const_google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> local_e0;
  undefined1 local_d8 [8];
  FeatureSet features;
  Status local_80;
  iterator local_78;
  iterator local_70;
  ContainerIter<const_google::protobuf::RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>_>
  first_nonmatch;
  undefined1 local_58 [8];
  FeatureSetEditionDefault search;
  anon_class_1_0_00000001_for__M_comp comparator;
  FeatureSetDefaults *defaults_local;
  Edition edition_local;
  
  FeatureSetDefaults_FeatureSetEditionDefault::FeatureSetDefaults_FeatureSetEditionDefault
            ((FeatureSetDefaults_FeatureSetEditionDefault *)local_58);
  FeatureSetDefaults_FeatureSetEditionDefault::set_edition
            ((FeatureSetDefaults_FeatureSetEditionDefault *)local_58,edition);
  pRVar2 = FeatureSetDefaults::defaults(defaults);
  local_70.it_ = (void **)absl::lts_20250127::
                          c_upper_bound<google::protobuf::RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>const,google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault,google::protobuf::internal::GetEditionFeatureSetDefaults(google::protobuf::Edition,google::protobuf::FeatureSetDefaults_const&)::__0&>
                                    (pRVar2,(FeatureSetDefaults_FeatureSetEditionDefault *)local_58,
                                     (anon_class_1_0_00000001_for__M_comp *)
                                     ((long)&search.field_0 + 0x1f));
  pRVar2 = FeatureSetDefaults::defaults(defaults);
  local_78.it_ = (void **)RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                          ::begin(pRVar2);
  bVar1 = operator==(&local_70,&local_78);
  if (bVar1) {
    protobuf::(anonymous_namespace)::Error<char_const*,google::protobuf::Edition>
              ((_anonymous_namespace_ *)&local_80,"No valid default found for edition ",edition);
    absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::
    StatusOr<absl::lts_20250127::Status,_0>(__return_storage_ptr__,&local_80);
    absl::lts_20250127::Status::~Status(&local_80);
    features.field_0._impl_.default_symbol_visibility_ = 1;
  }
  else {
    local_e8 = local_70.it_;
    local_e0 = std::
               prev<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault_const>>
                         (local_70.it_,1);
    pFVar3 = RepeatedPtrIterator<const_google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
             ::operator->(&local_e0);
    pFVar4 = FeatureSetDefaults_FeatureSetEditionDefault::fixed_features(pFVar3);
    FeatureSet::FeatureSet((FeatureSet *)local_d8,pFVar4);
    local_f0 = std::
               prev<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault_const>>
                         (local_70.it_,1);
    pFVar3 = RepeatedPtrIterator<const_google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
             ::operator->(&local_f0);
    pFVar4 = FeatureSetDefaults_FeatureSetEditionDefault::overridable_features(pFVar3);
    FeatureSet::MergeFrom((FeatureSet *)local_d8,pFVar4);
    absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::
    StatusOr<google::protobuf::FeatureSet,_0>(__return_storage_ptr__,(FeatureSet *)local_d8);
    features.field_0._impl_.default_symbol_visibility_ = 1;
    FeatureSet::~FeatureSet((FeatureSet *)local_d8);
  }
  FeatureSetDefaults_FeatureSetEditionDefault::~FeatureSetDefaults_FeatureSetEditionDefault
            ((FeatureSetDefaults_FeatureSetEditionDefault *)local_58);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureSet> GetEditionFeatureSetDefaults(
    Edition edition, const FeatureSetDefaults& defaults) {
  // Select the matching edition defaults.
  auto comparator = [](const auto& a, const auto& b) {
    return a.edition() < b.edition();
  };
  FeatureSetDefaults::FeatureSetEditionDefault search;
  search.set_edition(edition);
  auto first_nonmatch =
      absl::c_upper_bound(defaults.defaults(), search, comparator);
  if (first_nonmatch == defaults.defaults().begin()) {
    return Error("No valid default found for edition ", edition);
  }
  FeatureSet features = std::prev(first_nonmatch)->fixed_features();
  features.MergeFrom(std::prev(first_nonmatch)->overridable_features());
  return features;
}